

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_file.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  istream *piVar1;
  ostream *poVar2;
  value_type local_2a0;
  truth_table tt;
  string line;
  truth_table_set classes;
  ifstream in;
  
  classes._M_h._M_buckets = &classes._M_h._M_single_bucket;
  classes._M_h._M_bucket_count = 1;
  classes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  classes._M_h._M_element_count = 0;
  classes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  classes._M_h._M_rehash_policy._M_next_resize = 0;
  classes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tt._bits = 0;
  std::ifstream::ifstream(&in,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    kitty::create_from_hex_string<kitty::static_truth_table<4u,true>>(&tt,&line);
    local_2a0._bits =
         (uint64_t)
         kitty::
         exact_spectral_canonization<kitty::static_truth_table<4u,true>,void(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                   (&tt,kitty::detail::exact_spectral_canonization_null_callback);
    std::__detail::
    _Insert<kitty::static_truth_table<4U,_true>,_kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Identity,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<kitty::static_truth_table<4U,_true>,_kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Identity,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&classes,&local_2a0);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[i] enumerated ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," functions into ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," classes.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&in);
  std::
  _Hashtable<kitty::static_truth_table<4U,_true>,_kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Identity,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&classes._M_h);
  return 0;
}

Assistant:

int main( int argc, char ** argv )
{
  (void)argc;

  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* truth table type in this example */
  using truth_table = kitty::static_truth_table<num_vars>;

  /* set to store all NPN and spectral representatives */
  using truth_table_set = std::unordered_set<truth_table, kitty::hash<truth_table>>;
  truth_table_set classes;

  truth_table tt;
  auto ctr = 0u;

  std::ifstream in( argv[1] );

  std::string line;
  while ( std::getline( in, line ) )
  {
    create_from_hex_string( tt, line );
    classes.insert( kitty::exact_spectral_canonization( tt ) );

    ++ctr;
  }

  std::cout << "[i] enumerated "
            << ctr << " functions into "
            << classes.size() << " classes." << std::endl;

  return 0;
}